

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O0

Vec_Ptr_t * Aig_ManCofactorBdds(Aig_Man_t *p,Vec_Ptr_t *vSubset,DdManager *dd,DdNode *bFunc)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  DdNode **pbVars_00;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  undefined4 local_54;
  int i;
  DdNode **pbVars;
  DdNode *bCof;
  DdNode *bTemp;
  DdNode *bCube;
  Vec_Ptr_t *vCofs;
  DdNode *bFunc_local;
  DdManager *dd_local;
  Vec_Ptr_t *vSubset_local;
  Aig_Man_t *p_local;
  
  p_00 = Vec_PtrAlloc(100);
  pbVars_00 = (DdNode **)Vec_PtrArray(vSubset);
  local_54 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vSubset);
    if (1 << ((byte)iVar1 & 0x1f) <= local_54) break;
    iVar1 = Vec_PtrSize(vSubset);
    n = Extra_bddBitsToCube(dd,local_54,iVar1,pbVars_00,1);
    Cudd_Ref(n);
    n_00 = Cudd_Cofactor(dd,bFunc,n);
    Cudd_Ref(n_00);
    n_01 = Cudd_bddAnd(dd,n_00,n);
    Cudd_Ref(n_01);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,n);
    Vec_PtrPush(p_00,n_01);
    local_54 = local_54 + 1;
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManCofactorBdds( Aig_Man_t * p, Vec_Ptr_t * vSubset, DdManager * dd, DdNode * bFunc )
{
    Vec_Ptr_t * vCofs;
    DdNode * bCube, * bTemp, * bCof, ** pbVars;
    int i;
    vCofs = Vec_PtrAlloc( 100 );
    pbVars = (DdNode **)Vec_PtrArray(vSubset);
    for ( i = 0; i < (1 << Vec_PtrSize(vSubset)); i++ )
    {
        bCube = Extra_bddBitsToCube( dd, i, Vec_PtrSize(vSubset), pbVars, 1 );  Cudd_Ref( bCube );
        bCof  = Cudd_Cofactor( dd, bFunc, bCube );        Cudd_Ref( bCof );
        bCof  = Cudd_bddAnd( dd, bTemp = bCof, bCube );   Cudd_Ref( bCof );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        Vec_PtrPush( vCofs, bCof );
    }
    return vCofs;
}